

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::BiOpExpr::BiOpExpr
          (BiOpExpr *this,Lexer *lexer,Position *pos,Token *tokOp,TokenType opType,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *rhs)

{
  bool bVar1;
  pointer pEVar2;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs_local;
  TokenType opType_local;
  Token *tokOp_local;
  Position *pos_local;
  Lexer *lexer_local;
  BiOpExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_BIOP,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__BiOpExpr_0017f998;
  this->tokOp = tokOp;
  this->opType = opType;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr(&this->lhs,lhs);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr(&this->rhs,rhs);
  if (this->tokOp == (Token *)0x0) {
    __assert_fail("this->tokOp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x313,
                  "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  bVar1 = isTokenTypeOperator(this->opType);
  if (!bVar1) {
    __assert_fail("isTokenTypeOperator(this->opType)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x314,
                  "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->lhs);
  if (!bVar1) {
    __assert_fail("!!this->lhs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x315,
                  "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->rhs);
  if (!bVar1) {
    __assert_fail("!!this->rhs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x316,
                  "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->lhs);
  Expr::setParent(pEVar2,&this->super_Expr);
  pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->rhs);
  Expr::setParent(pEVar2,&this->super_Expr);
  return;
}

Assistant:

BiOpExpr::BiOpExpr(const Lexer &lexer, const Position &pos,
     const Token *tokOp,
     TokenType opType,
     std::unique_ptr<Expr> &&lhs, std::unique_ptr<Expr> &&rhs) noexcept
     : Expr(lexer, ExprType::EXPR_BIOP, pos), tokOp{tokOp}, opType{opType},
       lhs(std::move(lhs)), rhs(std::move(rhs)) {
  assert(this->tokOp);
  assert(isTokenTypeOperator(this->opType));
  assert(!!this->lhs);
  assert(!!this->rhs);

  this->lhs->setParent(this);
  this->rhs->setParent(this);
}